

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O3

string * __thiscall
cmServerBufferStrategy::BufferMessage
          (string *__return_storage_ptr__,cmServerBufferStrategy *this,string *RawReadBuffer)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  ulong __n;
  int iVar4;
  long lVar5;
  string line;
  long *local_58;
  ulong local_50;
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  do {
    lVar5 = std::__cxx11::string::find((char)RawReadBuffer,10);
    if (lVar5 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_58,(ulong)RawReadBuffer);
    if ((1 < local_50) && (*(char *)((long)local_58 + (local_50 - 1)) == '\r')) {
      std::__cxx11::string::erase((ulong)&local_58,local_50 - 1);
    }
    pcVar1 = (RawReadBuffer->_M_dataplus)._M_p;
    if (pcVar1 + RawReadBuffer->_M_string_length == pcVar1 + lVar5 + 1) {
      RawReadBuffer->_M_string_length = 0;
      *pcVar1 = '\0';
    }
    else {
      std::__cxx11::string::_M_erase((ulong)RawReadBuffer,0);
    }
    __n = local_50;
    if ((local_50 == kSTART_MAGIC_abi_cxx11_._M_string_length) &&
       ((local_50 == 0 ||
        (iVar4 = bcmp(local_58,kSTART_MAGIC_abi_cxx11_._M_dataplus._M_p,local_50), iVar4 == 0)))) {
      (this->RequestBuffer)._M_string_length = 0;
      *(this->RequestBuffer)._M_dataplus._M_p = '\0';
LAB_003a0ac0:
      bVar2 = false;
    }
    else {
      plVar3 = local_58;
      if ((__n != kEND_MAGIC_abi_cxx11_._M_string_length) ||
         ((__n != 0 &&
          (iVar4 = bcmp(local_58,kEND_MAGIC_abi_cxx11_._M_dataplus._M_p,__n), iVar4 != 0)))) {
        std::__cxx11::string::_M_append((char *)&this->RequestBuffer,(ulong)plVar3);
        std::__cxx11::string::append((char *)&this->RequestBuffer);
        goto LAB_003a0ac0;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::swap((string *)__return_storage_ptr__);
      bVar2 = true;
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (bVar2) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string cmServerBufferStrategy::BufferMessage(std::string& RawReadBuffer)
{
  for (;;) {
    auto needle = RawReadBuffer.find('\n');

    if (needle == std::string::npos) {
      return "";
    }
    std::string line = RawReadBuffer.substr(0, needle);
    const auto ls = line.size();
    if (ls > 1 && line.at(ls - 1) == '\r') {
      line.erase(ls - 1, 1);
    }
    RawReadBuffer.erase(RawReadBuffer.begin(),
                        RawReadBuffer.begin() + static_cast<long>(needle) + 1);
    if (line == kSTART_MAGIC) {
      RequestBuffer.clear();
      continue;
    }
    if (line == kEND_MAGIC) {
      std::string rtn;
      rtn.swap(this->RequestBuffer);
      return rtn;
    }

    this->RequestBuffer += line;
    this->RequestBuffer += "\n";
  }
}